

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateCloningCode
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  int iVar2;
  mapped_type *pmVar3;
  FieldDescriptor *pFVar4;
  OneofDescriptor *pOVar5;
  FieldGeneratorBase *pFVar6;
  string *psVar7;
  FieldDescriptor *descriptor;
  allocator local_191;
  key_type local_190;
  string local_170;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> local_150;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> generator_1;
  FieldDescriptor *field;
  int j;
  string local_118;
  allocator local_f1;
  key_type local_f0;
  string local_d0;
  int local_ac;
  int i_1;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> generator;
  int i;
  string local_78;
  undefined1 local_48 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_48);
  SourceGeneratorBase::WriteGeneratedCodeAttributes
            (&this->super_SourceGeneratorBase,
             (Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  class_name_abi_cxx11_(&local_78,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"class_name",(allocator *)((long)&generator.ptr_ + 7));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_48,(key_type *)&i);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_78);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)((long)&generator.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_78);
  io::Printer::Print((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_48,"public $class_name$($class_name$ other) : this() {\n");
  io::Printer::Indent((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  generator.ptr_._0_4_ = 0;
  while( true ) {
    iVar1 = (int)generator.ptr_;
    iVar2 = Descriptor::field_count(this->descriptor_);
    if (iVar2 <= iVar1) break;
    pFVar4 = Descriptor::field(this->descriptor_,(int)generator.ptr_);
    pOVar5 = FieldDescriptor::containing_oneof(pFVar4);
    if (pOVar5 == (OneofDescriptor *)0x0) {
      pFVar4 = Descriptor::field(this->descriptor_,(int)generator.ptr_);
      pFVar6 = CreateFieldGeneratorInternal(this,pFVar4);
      internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::scoped_ptr
                ((scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> *)
                 &stack0xffffffffffffff58,pFVar6);
      pFVar6 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::
               operator->((scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> *)
                          &stack0xffffffffffffff58);
      (*(pFVar6->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[2])
                (pFVar6,vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
      internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::~scoped_ptr
                ((scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> *)
                 &stack0xffffffffffffff58);
    }
    generator.ptr_._0_4_ = (int)generator.ptr_ + 1;
  }
  local_ac = 0;
  while( true ) {
    iVar1 = local_ac;
    iVar2 = Descriptor::oneof_decl_count(this->descriptor_);
    if (iVar2 <= iVar1) break;
    pOVar5 = Descriptor::oneof_decl(this->descriptor_,local_ac);
    psVar7 = OneofDescriptor::name_abi_cxx11_(pOVar5);
    UnderscoresToCamelCase(&local_d0,psVar7,false);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f0,"name",&local_f1);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_48,&local_f0);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    std::__cxx11::string::~string((string *)&local_d0);
    pOVar5 = Descriptor::oneof_decl(this->descriptor_,local_ac);
    psVar7 = OneofDescriptor::name_abi_cxx11_(pOVar5);
    UnderscoresToCamelCase(&local_118,psVar7,true);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&j,"property_name",(allocator *)((long)&field + 7));
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_48,(key_type *)&j);
    std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_118);
    std::__cxx11::string::~string((string *)&j);
    std::allocator<char>::~allocator((allocator<char> *)((long)&field + 7));
    std::__cxx11::string::~string((string *)&local_118);
    io::Printer::Print((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_48,"switch (other.$property_name$Case) {\n");
    io::Printer::Indent((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    field._0_4_ = 0;
    while( true ) {
      iVar1 = (int)field;
      pOVar5 = Descriptor::oneof_decl(this->descriptor_,local_ac);
      iVar2 = OneofDescriptor::field_count(pOVar5);
      if (iVar2 <= iVar1) break;
      pOVar5 = Descriptor::oneof_decl(this->descriptor_,local_ac);
      generator_1.ptr_ = (FieldGeneratorBase *)OneofDescriptor::field(pOVar5,(int)field);
      pFVar6 = CreateFieldGeneratorInternal(this,(FieldDescriptor *)generator_1.ptr_);
      internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::scoped_ptr
                (&local_150,pFVar6);
      GetPropertyName_abi_cxx11_(&local_170,(csharp *)generator_1.ptr_,descriptor);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_190,"field_property_name",&local_191);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_48,&local_190);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      std::__cxx11::string::~string((string *)&local_170);
      io::Printer::Print((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_48,"case $property_name$OneofCase.$field_property_name$:\n");
      io::Printer::Indent((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
      pFVar6 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::
               operator->(&local_150);
      (*(pFVar6->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[2])
                (pFVar6,vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
      io::Printer::Print((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,"break;\n"
                        );
      io::Printer::Outdent((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
      internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::~scoped_ptr
                (&local_150);
      field._0_4_ = (int)field + 1;
    }
    io::Printer::Outdent((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    io::Printer::Print((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,"}\n\n");
    local_ac = local_ac + 1;
  }
  io::Printer::Outdent((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  io::Printer::Print((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,"}\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes
            (&this->super_SourceGeneratorBase,
             (Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  io::Printer::Print((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_48,
                     "public $class_name$ Clone() {\n  return new $class_name$(this);\n}\n\n");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_48);
  return;
}

Assistant:

void MessageGenerator::GenerateCloningCode(io::Printer* printer) {
  map<string, string> vars;
  WriteGeneratedCodeAttributes(printer);
  vars["class_name"] = class_name();
    printer->Print(
    vars,
    "public $class_name$($class_name$ other) : this() {\n");
  printer->Indent();
  // Clone non-oneof fields first
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->containing_oneof()) {
      scoped_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(descriptor_->field(i)));
      generator->GenerateCloningCode(printer);
    }
  }
  // Clone just the right field for each oneof
  for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
    vars["name"] = UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), false);
    vars["property_name"] = UnderscoresToCamelCase(
        descriptor_->oneof_decl(i)->name(), true);
    printer->Print(vars, "switch (other.$property_name$Case) {\n");
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      scoped_ptr<FieldGeneratorBase> generator(CreateFieldGeneratorInternal(field));
      vars["field_property_name"] = GetPropertyName(field);
      printer->Print(
          vars,
          "case $property_name$OneofCase.$field_property_name$:\n");
      printer->Indent();
      generator->GenerateCloningCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Outdent();
    printer->Print("}\n\n");
  }

  printer->Outdent();
  printer->Print("}\n\n");

  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    vars,
    "public $class_name$ Clone() {\n"
    "  return new $class_name$(this);\n"
    "}\n\n");
}